

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O1

int X509_CRL_add0_revoked(X509_CRL *crl,X509_REVOKED *rev)

{
  X509_CRL_INFO *pXVar1;
  OPENSSL_STACK *pOVar2;
  size_t sVar3;
  int iVar4;
  
  pXVar1 = crl->crl;
  if (pXVar1->revoked == (stack_st_X509_REVOKED *)0x0) {
    pOVar2 = OPENSSL_sk_new(X509_REVOKED_cmp);
    pXVar1->revoked = (stack_st_X509_REVOKED *)pOVar2;
  }
  iVar4 = 0;
  if ((OPENSSL_STACK *)pXVar1->revoked != (OPENSSL_STACK *)0x0) {
    sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)pXVar1->revoked,rev);
    iVar4 = 0;
    if (sVar3 != 0) {
      asn1_encoding_clear((ASN1_ENCODING *)&pXVar1->enc);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int X509_CRL_add0_revoked(X509_CRL *crl, X509_REVOKED *rev) {
  X509_CRL_INFO *inf;
  inf = crl->crl;
  if (!inf->revoked) {
    inf->revoked = sk_X509_REVOKED_new(X509_REVOKED_cmp);
  }
  if (!inf->revoked || !sk_X509_REVOKED_push(inf->revoked, rev)) {
    return 0;
  }
  asn1_encoding_clear(&inf->enc);
  return 1;
}